

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

string * __thiscall
tonk::HexString_abi_cxx11_(string *__return_storage_ptr__,tonk *this,uint64_t value)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s;
  char hex [17];
  char acStack_28 [14];
  char local_1a [10];
  
  pcVar4 = local_1a;
  iVar2 = 8;
  local_1a[2] = 0;
  do {
    cVar1 = "0123456789abcdef"[(uint)this >> 4 & 0xf];
    pcVar4[1] = "0123456789abcdef"[(uint)this & 0xf];
    *pcVar4 = cVar1;
    __s = pcVar4;
    if (this < (tonk *)0x100) break;
    this = (tonk *)((ulong)this >> 8);
    pcVar4 = pcVar4 + -2;
    iVar2 = iVar2 + -1;
    __s = acStack_28;
  } while (iVar2 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string HexString(uint64_t value)
{
    static const char* H = "0123456789abcdef";

    char hex[16 + 1];
    hex[16] = '\0';

    char* hexWrite = &hex[14];
    for (unsigned i = 0; i < 8; ++i)
    {
        hexWrite[1] = H[value & 15];
        hexWrite[0] = H[(value >> 4) & 15];

        value >>= 8;
        if (value == 0)
            return hexWrite;
        hexWrite -= 2;
    }

    return hex;
}